

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O0

bool __thiscall Potassco::ProgramReader::parse(ProgramReader *this,ReadMode m)

{
  bool bVar1;
  uint uVar2;
  int in_ESI;
  BufferedStream *in_RDI;
  bool local_22;
  bool cnd;
  BufferedStream *this_00;
  
  this_00 = in_RDI;
  if ((StreamType *)in_RDI->buf_ == (StreamType *)0x0) {
    fail(-2,"bool Potassco::ProgramReader::parse(ReadMode)",0x9f,"str_ != 0","no input stream",0);
  }
  do {
    uVar2 = (**(_func_int **)(in_RDI->str_ + 0x18))();
    if ((uVar2 & 1) == 0) {
      return false;
    }
    stream((ProgramReader *)in_RDI);
    BufferedStream::skipWs(this_00);
    bVar1 = more((ProgramReader *)in_RDI);
    cnd = true;
    if (bVar1) {
      cnd = incremental((ProgramReader *)in_RDI);
    }
    require((ProgramReader *)in_RDI,cnd,(char *)0x127d26);
    local_22 = false;
    if (in_ESI == 1) {
      local_22 = more((ProgramReader *)in_RDI);
    }
  } while (local_22 != false);
  return true;
}

Assistant:

bool ProgramReader::parse(ReadMode m) {
	POTASSCO_REQUIRE(str_ != 0, "no input stream");
	do {
		if (!doParse()) { return false; }
		stream()->skipWs();
		require(!more() || incremental(), "invalid extra input");
	} while (m == Complete && more());
	return true;
}